

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O3

void ares_hosts_entry_destroy(ares_hosts_entry_t *entry)

{
  size_t sVar1;
  
  if ((entry != (ares_hosts_entry_t *)0x0) &&
     ((entry->refcnt == 0 || (sVar1 = entry->refcnt - 1, entry->refcnt = sVar1, sVar1 == 0)))) {
    ares_llist_destroy(entry->hosts);
    ares_llist_destroy(entry->ips);
    ares_free(entry);
    return;
  }
  return;
}

Assistant:

static void ares_hosts_entry_destroy(ares_hosts_entry_t *entry)
{
  if (entry == NULL) {
    return;
  }

  /* Honor reference counting */
  if (entry->refcnt != 0) {
    entry->refcnt--;
  }

  if (entry->refcnt > 0) {
    return;
  }

  ares_llist_destroy(entry->hosts);
  ares_llist_destroy(entry->ips);
  ares_free(entry);
}